

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O3

void __thiscall pbrt::syntactic::MappedFile::MappedFile(MappedFile *this,string *fn)

{
  FileMapping *this_00;
  pointer pcVar1;
  uint8_t *puVar2;
  size_t sVar3;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (fn->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + fn->_M_string_length);
  this_00 = &this->file_;
  FileMapping::FileMapping(this_00,fn);
  puVar2 = FileMapping::data(this_00);
  sVar3 = FileMapping::nbytes(this_00);
  (this->data_).ptr = (char *)puVar2;
  (this->data_).count = sVar3;
  this->pos_ = (char *)puVar2;
  return;
}

Assistant:

MappedFile(const std::string &fn)
        : name_(fn)
        , file_(fn)
        , data_(reinterpret_cast<const char*>(file_.data()), file_.nbytes())
        , pos_(data_.cbegin())
      {
      }